

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
boost::exception_detail::
clone_impl<boost::exception_detail::error_info_injector<boost::system::system_error>_>::clone_impl
          (void *param_1,exception *param_2)

{
  error_info_injector<boost::system::system_error> *in_stack_ffffffffffffffc8;
  exception *a;
  
  a = (exception *)param_1;
  clone_base::clone_base((clone_base *)((long)param_1 + 0x68));
  error_info_injector<boost::system::system_error>::error_info_injector
            ((error_info_injector<boost::system::system_error> *)param_1,in_stack_ffffffffffffffc8);
  *(undefined8 *)&((error_info_injector<boost::system::system_error> *)param_1)->super_system_error
       = 0x14fc68;
  (((error_info_injector<boost::system::system_error> *)param_1)->super_exception)._vptr_exception =
       (_func_int **)0x14fca0;
  *(undefined8 *)
   &((error_info_injector<boost::system::system_error> *)((long)param_1 + 0x68))->super_system_error
       = 0x14fcd8;
  copy_boost_exception(a,param_2);
  return;
}

Assistant:

clone_impl( clone_impl const & x, clone_tag ):
                T(x)
                {
                copy_boost_exception(this,&x);
                }